

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprSynonymList(Fts5ExprTerm *pTerm,i64 iRowid,Fts5Buffer *pBuf,u8 **pa,int *pn)

{
  undefined8 *puVar1;
  Fts5IndexIter *pFVar2;
  u8 *a;
  int iVar3;
  int iVar4;
  undefined8 *__dest;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long iPos;
  i64 *piOff;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  undefined8 *local_f0;
  int local_e8;
  Fts5PoslistWriter local_c0;
  undefined8 local_b8 [17];
  
  if (pTerm == (Fts5ExprTerm *)0x0) {
    local_f0 = local_b8;
    uVar6 = 0;
  }
  else {
    local_e8 = 4;
    uVar6 = 0;
    local_f0 = local_b8;
    do {
      pFVar2 = pTerm->pIter;
      if (((pFVar2->bEof == '\0') && (pFVar2->iRowid == iRowid)) && (pFVar2->nData != 0)) {
        iVar4 = (int)uVar6;
        __dest = local_f0;
        if (iVar4 == local_e8) {
          iVar3 = sqlite3_initialize();
          if (iVar3 == 0) {
            __dest = (undefined8 *)sqlite3Malloc((long)iVar4 << 6);
            if (__dest != (undefined8 *)0x0) {
              memcpy(__dest,local_f0,(long)iVar4 << 5);
              local_e8 = iVar4 * 2;
              if (local_f0 != local_b8) {
                sqlite3_free(local_f0);
              }
              goto LAB_001a7fd5;
            }
          }
          iVar4 = 7;
          goto LAB_001a814a;
        }
LAB_001a7fd5:
        lVar8 = (long)iVar4;
        a = pFVar2->pData;
        iVar3 = pFVar2->nData;
        puVar1 = __dest + lVar8 * 4;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        *puVar1 = a;
        *(int *)(puVar1 + 1) = iVar3;
        iVar3 = sqlite3Fts5PoslistNext64(a,iVar3,(int *)((long)puVar1 + 0xc),__dest + lVar8 * 4 + 3)
        ;
        if (iVar3 != 0) {
          *(undefined1 *)((long)__dest + lVar8 * 0x20 + 0x11) = 1;
        }
        uVar6 = (ulong)(iVar4 + 1);
        local_f0 = __dest;
      }
      pTerm = pTerm->pSynonym;
    } while (pTerm != (Fts5ExprTerm *)0x0);
    if ((int)uVar6 == 1) {
      *pa = (u8 *)*local_f0;
      *pn = *(int *)(local_f0 + 1);
      iVar4 = 0;
      goto LAB_001a814a;
    }
  }
  iVar4 = 0;
  local_c0.iPrev = 0;
  pBuf->n = 0;
  if (0 < (int)uVar6) {
    iVar4 = 0;
    lVar8 = -1;
    do {
      iPos = 0x7fffffffffffffff;
      uVar7 = uVar6;
      piOff = local_f0 + 3;
      do {
        if (*(char *)((long)piOff + -7) == '\0') {
          lVar5 = *piOff;
          if (lVar5 == lVar8) {
            iVar3 = sqlite3Fts5PoslistNext64
                              ((u8 *)piOff[-3],(int)piOff[-2],(int *)((long)piOff + -0xc),piOff);
            if (iVar3 == 0) {
              if (*(char *)((long)piOff + -7) == '\0') {
                lVar5 = *piOff;
                goto LAB_001a80e5;
              }
            }
            else {
              *(undefined1 *)((long)piOff + -7) = 1;
            }
          }
          else {
LAB_001a80e5:
            if (lVar5 < iPos) {
              iPos = lVar5;
            }
          }
        }
        piOff = piOff + 4;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    } while (((iPos != 0x7fffffffffffffff) && (iVar4 == 0)) &&
            (iVar4 = sqlite3Fts5PoslistWriterAppend(pBuf,&local_c0,iPos), lVar8 = iPos,
            0 < (int)uVar6));
  }
  if (iVar4 == 0) {
    *pa = pBuf->p;
    *pn = pBuf->n;
  }
LAB_001a814a:
  if (local_f0 != local_b8) {
    sqlite3_free(local_f0);
  }
  return iVar4;
}

Assistant:

static int fts5ExprSynonymList(
  Fts5ExprTerm *pTerm, 
  i64 iRowid,
  Fts5Buffer *pBuf,               /* Use this buffer for space if required */
  u8 **pa, int *pn
){
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int nIter = 0;
  int nAlloc = 4;
  int rc = SQLITE_OK;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  for(p=pTerm; p; p=p->pSynonym){
    Fts5IndexIter *pIter = p->pIter;
    if( sqlite3Fts5IterEof(pIter)==0 && pIter->iRowid==iRowid ){
      if( pIter->nData==0 ) continue;
      if( nIter==nAlloc ){
        sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nAlloc * 2;
        Fts5PoslistReader *aNew = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
          goto synonym_poslist_out;
        }
        memcpy(aNew, aIter, sizeof(Fts5PoslistReader) * nIter);
        nAlloc = nAlloc*2;
        if( aIter!=aStatic ) sqlite3_free(aIter);
        aIter = aNew;
      }
      sqlite3Fts5PoslistReaderInit(pIter->pData, pIter->nData, &aIter[nIter]);
      assert( aIter[nIter].bEof==0 );
      nIter++;
    }
  }

  if( nIter==1 ){
    *pa = (u8*)aIter[0].a;
    *pn = aIter[0].n;
  }else{
    Fts5PoslistWriter writer = {0};
    i64 iPrev = -1;
    fts5BufferZero(pBuf);
    while( 1 ){
      int i;
      i64 iMin = FTS5_LARGEST_INT64;
      for(i=0; i<nIter; i++){
        if( aIter[i].bEof==0 ){
          if( aIter[i].iPos==iPrev ){
            if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) continue;
          }
          if( aIter[i].iPos<iMin ){
            iMin = aIter[i].iPos;
          }
        }
      }
      if( iMin==FTS5_LARGEST_INT64 || rc!=SQLITE_OK ) break;
      rc = sqlite3Fts5PoslistWriterAppend(pBuf, &writer, iMin);
      iPrev = iMin;
    }
    if( rc==SQLITE_OK ){
      *pa = pBuf->p;
      *pn = pBuf->n;
    }
  }

 synonym_poslist_out:
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}